

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper_common.cpp
# Opt level: O2

void src_DestinationOut(uint32_t *dest,int length,uint32_t *src,uint32_t alpha)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  
  uVar1 = 0;
  if (0 < length) {
    uVar1 = (ulong)(uint)length;
  }
  if (alpha == 0xff) {
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      dest[uVar2] = (dest[uVar2] & 0xff00ff) * (~src[uVar2] >> 0x18) >> 8 & 0xff00ff |
                    (dest[uVar2] >> 8 & 0xff00ff) * (~src[uVar2] >> 0x18) & 0xff00ff00;
    }
  }
  else {
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      iVar3 = (((~src[uVar2] >> 0x18) * alpha >> 8 & 0xff00ff) - alpha) + 0xff;
      dest[uVar2] = (dest[uVar2] & 0xff00ff) * iVar3 >> 8 & 0xff00ff |
                    (dest[uVar2] >> 8 & 0xff00ff) * iVar3 & 0xff00ff00;
    }
  }
  return;
}

Assistant:

static void src_DestinationOut(uint32_t *dest, int length, const uint32_t *src,
                               uint32_t alpha)
{
    if (alpha == 255) {
        for (int i = 0; i < length; ++i) {
            dest[i] = BYTE_MUL(dest[i], vAlpha(~src[i]));
        }
    } else {
        uint32_t cia = 255 - alpha;
        for (int i = 0; i < length; ++i) {
            uint32_t sia = BYTE_MUL(vAlpha(~src[i]), alpha) + cia;
            dest[i] = BYTE_MUL(dest[i], sia);
        }
    }
}